

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall
mp::internal::FormatRST(internal *this,Writer *w,CStringRef s,int indent,ValueArrayRef values)

{
  undefined4 in_register_0000000c;
  Parser parser;
  RSTFormatter formatter;
  Parser local_a0;
  RSTFormatter local_90;
  
  local_90.super_ContentHandler._vptr_ContentHandler = (_func_int **)&PTR__RSTFormatter_004cc560;
  local_90.values_.values_ = (OptionValueInfo *)CONCAT44(in_register_0000000c,indent);
  local_90.values_.size_ = (int)values.values_;
  local_90.writer_ = (Writer *)this;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&local_90.indents_);
  local_a0.handler_ = &local_90.super_ContentHandler;
  local_90.indent_ = (int)s.data_;
  local_90.pos_in_line_ = 0;
  local_90.end_block_ = false;
  local_a0.ptr_ = (char *)0x0;
  rst::Parser::Parse(&local_a0,(char *)w);
  anon_unknown.dwarf_76a6bf::RSTFormatter::~RSTFormatter(&local_90);
  return;
}

Assistant:

void FormatRST(fmt::Writer &w,
    fmt::CStringRef s, int indent, ValueArrayRef values) {
  RSTFormatter formatter(w, values, indent);
  rst::Parser parser(&formatter);
  parser.Parse(s.c_str());
}